

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_heap.h
# Opt level: O1

void __thiscall csbpl_common::Heap<double>::insert(Heap<double> *this,Ptr *e)

{
  double dVar1;
  pointer psVar2;
  double *pdVar3;
  undefined8 uVar4;
  pointer psVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Ptr temp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  ((e->super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ->heap_index_ =
       (int)((ulong)((long)(this->data_).
                           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->data_).
                          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::
  vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ::push_back(&this->data_,e);
  iVar6 = (int)((ulong)((long)(this->data_).
                              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->data_).
                             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (iVar6 + -1 == 0) {
    iVar7 = -1;
  }
  else {
    iVar7 = (iVar6 - (iVar6 + -2 >> 0x1f)) + -2 >> 1;
  }
  if (iVar7 != -1) {
    iVar6 = iVar6 + -1;
    do {
      psVar2 = (this->data_).
               super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar3 = &(psVar2[iVar6].
                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->key_;
      dVar1 = (psVar2[iVar7].
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->key_;
      if (dVar1 < *pdVar3 || dVar1 == *pdVar3) {
        return;
      }
      uVar4 = psVar2[iVar6].
              super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
      local_38._M_pi =
           psVar2[iVar6].
           super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
        }
      }
      psVar5 = (this->data_).
               super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = psVar5 + iVar7;
      psVar5 = psVar5 + iVar6;
      (psVar5->super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = (psVar2->
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(psVar5->
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,
                 &(psVar2->
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount);
      psVar2 = (this->data_).
               super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(int *)((long)psVar2[iVar6].
                     super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + 8) = iVar6;
      psVar2 = psVar2 + iVar7;
      (psVar2->super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = (element_type *)uVar4;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(psVar2->
                  super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,&local_38);
      *(int *)((long)(this->data_).
                     super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar7].
                     super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + 8) = iVar7;
      if (iVar7 == 0) {
        iVar8 = -1;
      }
      else {
        iVar8 = (iVar7 - (iVar7 + -1 >> 0x1f)) + -1 >> 1;
      }
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      iVar6 = iVar7;
      iVar7 = iVar8;
    } while (iVar8 != -1);
  }
  return;
}

Assistant:

void insert(Ptr e)
  {
    e->heap_index_ = static_cast<int>(data_.size());
    data_.push_back(e);

    // Percolate up
    int i = size() - 1;
    int parent = getParent(i);
    while (parent != -1 && data_[i]->key_ < data_[parent]->key_)
    {
      // Perform a swap
      Ptr temp = data_[i];
      data_[i] = data_[parent];
      data_[i]->heap_index_ = i;
      data_[parent] = temp;
      data_[parent]->heap_index_ = parent;
      // Continue to percolate up the tree
      i = parent;
      parent = getParent(parent);
    }
  }